

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::JoinerSession::SendRlyTx
          (Error *__return_storage_ptr__,JoinerSession *this,ByteArray *aDtlsMessage,
          bool aIncludeKek)

{
  CommissionerImpl *pCVar1;
  bool bVar2;
  uint16_t uVar3;
  Error *pEVar4;
  element_type *peVar5;
  ByteArray *pBVar6;
  ByteArray *aBytes;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  args_3;
  basic_string_view<char> bVar7;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  bool *in_stack_fffffffffffff998;
  undefined1 local_5c0 [8];
  ByteArray local_5b8;
  string local_5a0;
  string local_580;
  JoinerSession *local_560;
  anon_class_1_0_00000001 local_552;
  v10 local_551;
  v10 *local_550;
  char *local_548;
  string local_540;
  allocator local_519;
  string local_518;
  function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> local_4f8;
  ErrorCode local_4d4;
  Tlv local_4d0;
  Error local_4b0;
  anon_class_1_0_00000001 local_482;
  v10 local_481;
  v10 *local_480;
  size_t local_478;
  string local_470;
  Error local_450;
  ErrorCode local_424;
  Tlv local_420;
  Error local_400;
  ErrorCode local_3d4;
  ByteArray local_3d0;
  Tlv local_3b8;
  Error local_398;
  ErrorCode local_36c;
  Tlv local_368;
  Error local_348;
  ErrorCode local_31c;
  Tlv local_318;
  Error local_2f8;
  ErrorCode local_2d0;
  allocator local_2c9;
  string local_2c8;
  Error local_2a8;
  undefined1 local_270 [8];
  Request rlyTx;
  bool aIncludeKek_local;
  ByteArray *aDtlsMessage_local;
  JoinerSession *this_local;
  Error *error;
  undefined1 local_1b0 [16];
  v10 *local_1a0;
  ulong local_198;
  v10 *local_190;
  size_t sStack_188;
  string *local_180;
  v10 *local_178;
  v10 **local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>
  local_168;
  undefined1 local_110 [16];
  v10 *local_100;
  char *local_f8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  string *local_d8;
  v10 *local_d0;
  v10 *local_c8;
  char *pcStack_c0;
  string *local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  Error **local_80;
  undefined1 *local_78;
  Error **local_70;
  Error **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>
  *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool>
  *local_10;
  
  rlyTx.mEndpoint._6_1_ = 0;
  rlyTx.mEndpoint._7_1_ = aIncludeKek;
  Error::Error(__return_storage_ptr__);
  coap::Message::Message((Message *)local_270,kNonConfirmable,kPost);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"/c/tx",&local_2c9);
  coap::Message::SetUriPath(&local_2a8,(Message *)local_270,&local_2c8);
  pEVar4 = Error::operator=(__return_storage_ptr__,&local_2a8);
  local_2d0 = kNone;
  bVar2 = commissioner::operator!=(pEVar4,&local_2d0);
  Error::~Error(&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  if (!bVar2) {
    uVar3 = GetJoinerUdpPort(this);
    tlv::Tlv::Tlv(&local_318,kJoinerUdpPort,uVar3,kMeshCoP);
    AppendTlv(&local_2f8,(Message *)local_270,&local_318);
    pEVar4 = Error::operator=(__return_storage_ptr__,&local_2f8);
    local_31c = kNone;
    bVar2 = commissioner::operator!=(pEVar4,&local_31c);
    Error::~Error(&local_2f8);
    tlv::Tlv::~Tlv(&local_318);
    if (!bVar2) {
      uVar3 = GetJoinerRouterLocator(this);
      tlv::Tlv::Tlv(&local_368,kJoinerRouterLocator,uVar3,kMeshCoP);
      AppendTlv(&local_348,(Message *)local_270,&local_368);
      pEVar4 = Error::operator=(__return_storage_ptr__,&local_348);
      local_36c = kNone;
      bVar2 = commissioner::operator!=(pEVar4,&local_36c);
      Error::~Error(&local_348);
      tlv::Tlv::~Tlv(&local_368);
      if (!bVar2) {
        GetJoinerIid(&local_3d0,this);
        tlv::Tlv::Tlv(&local_3b8,kJoinerIID,&local_3d0,kMeshCoP);
        AppendTlv(&local_398,(Message *)local_270,&local_3b8);
        pEVar4 = Error::operator=(__return_storage_ptr__,&local_398);
        local_3d4 = kNone;
        bVar2 = commissioner::operator!=(pEVar4,&local_3d4);
        Error::~Error(&local_398);
        tlv::Tlv::~Tlv(&local_3b8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_3d0);
        if (!bVar2) {
          tlv::Tlv::Tlv(&local_420,kJoinerDtlsEncapsulation,aDtlsMessage,kMeshCoP);
          AppendTlv(&local_400,(Message *)local_270,&local_420);
          pEVar4 = Error::operator=(__return_storage_ptr__,&local_400);
          local_424 = kNone;
          bVar2 = commissioner::operator!=(pEVar4,&local_424);
          Error::~Error(&local_400);
          tlv::Tlv::~Tlv(&local_420);
          if (!bVar2) {
            if ((rlyTx.mEndpoint._7_1_ & 1) != 0) {
              peVar5 = std::
                       __shared_ptr_access<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&this->mDtlsSession);
              pBVar6 = DtlsSession::GetKek(peVar5);
              bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(pBVar6);
              if (bVar2) {
                SendRlyTx::anon_class_1_0_00000001::operator()(&local_482);
                local_170 = &local_480;
                local_178 = &local_481;
                bVar7 = ::fmt::v10::operator()(local_178);
                local_478 = bVar7.size_;
                local_480 = (v10 *)bVar7.data_;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                local_180 = &local_470;
                local_190 = local_480;
                sStack_188 = local_478;
                local_a0 = &local_190;
                local_1a0 = local_480;
                local_198 = local_478;
                local_98 = local_1a0;
                sStack_90 = local_198;
                error = (Error *)::fmt::v10::
                                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                           ();
                local_78 = local_1b0;
                local_80 = &error;
                local_60 = 0;
                fmt.size_ = 0;
                fmt.data_ = (char *)local_198;
                args.field_1.values_ = in_R9.values_;
                args.desc_ = (unsigned_long_long)local_80;
                local_70 = local_80;
                local_68 = local_80;
                local_58 = local_78;
                ::fmt::v10::vformat_abi_cxx11_(&local_470,local_1a0,fmt,args);
                Error::Error(&local_450,kInvalidState,&local_470);
                Error::operator=(__return_storage_ptr__,&local_450);
                Error::~Error(&local_450);
                std::__cxx11::string::~string((string *)&local_470);
                goto LAB_002e9c08;
              }
              peVar5 = std::
                       __shared_ptr_access<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&this->mDtlsSession);
              pBVar6 = DtlsSession::GetKek(peVar5);
              tlv::Tlv::Tlv(&local_4d0,kJoinerRouterKEK,pBVar6,kMeshCoP);
              AppendTlv(&local_4b0,(Message *)local_270,&local_4d0);
              pEVar4 = Error::operator=(__return_storage_ptr__,&local_4b0);
              local_4d4 = kNone;
              bVar2 = commissioner::operator!=(pEVar4,&local_4d4);
              Error::~Error(&local_4b0);
              tlv::Tlv::~Tlv(&local_4d0);
              if (bVar2) goto LAB_002e9c08;
            }
            pCVar1 = this->mCommImpl;
            std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
            function(&local_4f8,(nullptr_t)0x0);
            coap::CoapSecure::SendRequest(&pCVar1->mBrClient,(Request *)local_270,&local_4f8);
            std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
            ~function(&local_4f8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_518,"joiner-session",&local_519);
            SendRlyTx::anon_class_1_0_00000001::operator()(&local_552);
            local_a8 = &local_550;
            local_b0 = &local_551;
            bVar7 = ::fmt::v10::operator()(local_b0);
            local_548 = (char *)bVar7.size_;
            local_550 = (v10 *)bVar7.data_;
            ::fmt::v10::detail::
            check_format_string<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool_&,_FMT_COMPILE_STRING,_0>
                      ();
            local_560 = this;
            peVar5 = std::
                     __shared_ptr_access<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->mDtlsSession);
            DtlsSession::GetStateString_abi_cxx11_(&local_580,peVar5);
            GetJoinerId(&local_5b8,this);
            utils::Hex_abi_cxx11_(&local_5a0,(utils *)&local_5b8,aBytes);
            local_5c0 = (undefined1  [8])
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  (aDtlsMessage);
            local_b8 = &local_540;
            local_c8 = local_550;
            pcStack_c0 = local_548;
            local_d0 = (v10 *)&local_560;
            local_d8 = &local_580;
            local_e0 = &local_5a0;
            local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5c0;
            args_3.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                 ((long)&rlyTx.mEndpoint + 7);
            local_50 = &local_c8;
            local_100 = local_550;
            local_f8 = local_548;
            local_f0.values_ = args_3.values_;
            local_48 = local_100;
            pcStack_40 = local_f8;
            ::fmt::v10::
            make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,std::__cxx11::string,std::__cxx11::string,unsigned_long,bool>
                      (&local_168,local_d0,(void **)local_d8,local_e0,local_e8,
                       (unsigned_long *)args_3.values_,in_stack_fffffffffffff998);
            local_30 = local_110;
            local_38 = &local_168;
            local_20 = 0x74dde;
            fmt_00.size_ = 0x74dde;
            fmt_00.data_ = local_f8;
            args_00.field_1.values_ = args_3.values_;
            args_00.desc_ = (unsigned_long_long)local_38;
            local_28 = local_38;
            local_18 = local_30;
            local_10 = local_38;
            ::fmt::v10::vformat_abi_cxx11_(&local_540,local_100,fmt_00,args_00);
            Log(kDebug,&local_518,&local_540);
            std::__cxx11::string::~string((string *)&local_540);
            std::__cxx11::string::~string((string *)&local_5a0);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_5b8);
            std::__cxx11::string::~string((string *)&local_580);
            std::__cxx11::string::~string((string *)&local_518);
            std::allocator<char>::~allocator((allocator<char> *)&local_519);
          }
        }
      }
    }
  }
LAB_002e9c08:
  rlyTx.mEndpoint._6_1_ = 1;
  coap::Message::~Message((Message *)local_270);
  if ((rlyTx.mEndpoint._6_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JoinerSession::SendRlyTx(const ByteArray &aDtlsMessage, bool aIncludeKek)
{
    Error         error;
    coap::Request rlyTx{coap::Type::kNonConfirmable, coap::Code::kPost};

    SuccessOrExit(error = rlyTx.SetUriPath(uri::kRelayTx));

    SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerUdpPort, GetJoinerUdpPort()}));
    SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerRouterLocator, GetJoinerRouterLocator()}));
    SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerIID, GetJoinerIid()}));
    SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerDtlsEncapsulation, aDtlsMessage}));

    if (aIncludeKek)
    {
        VerifyOrExit(!mDtlsSession->GetKek().empty(), error = ERROR_INVALID_STATE("DTLS KEK is not available"));
        SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerRouterKEK, mDtlsSession->GetKek()}));
    }

    mCommImpl.mBrClient.SendRequest(rlyTx, nullptr);

    LOG_DEBUG(LOG_REGION_JOINER_SESSION,
              "session(={}) sent RLY_TX.ntf: SessionState={}, joinerID={}, length={}, includeKek={}",
              static_cast<void *>(this), mDtlsSession->GetStateString(), utils::Hex(GetJoinerId()), aDtlsMessage.size(),
              aIncludeKek);

exit:
    return error;
}